

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

RPCHelpMan * getblockstats(void)

{
  string name;
  string name_00;
  string name_01;
  string name_02;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string name_03;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string description_19;
  string description_20;
  string description_21;
  string description_22;
  string description_23;
  string description_24;
  string description_25;
  string description_26;
  string description_27;
  string description_28;
  string description_29;
  string description_30;
  string description_31;
  string description_32;
  string description_33;
  string description_34;
  string description_35;
  string description_36;
  Fallback fallback;
  Fallback fallback_00;
  Fallback fallback_01;
  Fallback fallback_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_19;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_20;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_21;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_22;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_23;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_24;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_25;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_26;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_27;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_28;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_29;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_30;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_31;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_32;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_33;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_34;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_35;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_37;
  string description_38;
  string description_39;
  string description_40;
  RPCMethodImpl fun;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_36;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  RPCArgOptions opts_02;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  long lVar32;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  undefined4 in_stack_ffffffffffffd328;
  undefined4 uVar33;
  undefined4 in_stack_ffffffffffffd32c;
  _Alloc_hider _Var34;
  undefined4 uVar35;
  undefined1 in_stack_ffffffffffffd330 [24];
  undefined8 in_stack_ffffffffffffd348;
  undefined8 in_stack_ffffffffffffd350;
  _Manager_type in_stack_ffffffffffffd358;
  undefined8 in_stack_ffffffffffffd360;
  undefined1 in_stack_ffffffffffffd368 [16];
  pointer in_stack_ffffffffffffd378;
  pointer pRVar36;
  pointer in_stack_ffffffffffffd380;
  pointer pRVar37;
  pointer in_stack_ffffffffffffd388;
  pointer pRVar38;
  pointer in_stack_ffffffffffffd390;
  pointer in_stack_ffffffffffffd398;
  pointer pRVar39;
  pointer in_stack_ffffffffffffd3a0;
  pointer pRVar40;
  pointer in_stack_ffffffffffffd3a8;
  pointer pRVar41;
  undefined8 in_stack_ffffffffffffd3b0;
  pointer in_stack_ffffffffffffd3b8;
  pointer pRVar42;
  pointer in_stack_ffffffffffffd3c0;
  pointer pRVar43;
  pointer in_stack_ffffffffffffd3c8;
  pointer pRVar44;
  _Invoker_type in_stack_ffffffffffffd3d0;
  pointer in_stack_ffffffffffffd3d8;
  pointer in_stack_ffffffffffffd3e0;
  pointer in_stack_ffffffffffffd3e8;
  undefined8 in_stack_ffffffffffffd3f0;
  pointer in_stack_ffffffffffffd3f8;
  pointer in_stack_ffffffffffffd400;
  pointer in_stack_ffffffffffffd408;
  undefined8 in_stack_ffffffffffffd410;
  pointer in_stack_ffffffffffffd418;
  pointer in_stack_ffffffffffffd420;
  allocator<char> local_2bca;
  allocator<char> local_2bc9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2bc8;
  allocator<char> local_2baa;
  allocator<char> local_2ba9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2ba8;
  allocator<char> local_2b8a;
  allocator<char> local_2b89;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b88;
  allocator<char> local_2b6a;
  allocator<char> local_2b69;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b68;
  allocator<char> local_2b4a;
  allocator<char> local_2b49;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b48;
  allocator<char> local_2b2a;
  allocator<char> local_2b29;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b28;
  allocator<char> local_2b0a;
  allocator<char> local_2b09;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b08;
  allocator<char> local_2aea;
  allocator<char> local_2ae9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2ae8;
  allocator<char> local_2aca;
  allocator<char> local_2ac9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2ac8;
  allocator<char> local_2aaa;
  allocator<char> local_2aa9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2aa8;
  allocator<char> local_2a8a;
  allocator<char> local_2a89;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a88;
  allocator<char> local_2a6a;
  allocator<char> local_2a69;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a68;
  allocator<char> local_2a4a;
  allocator<char> local_2a49;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a48;
  allocator<char> local_2a2a;
  allocator<char> local_2a29;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a28;
  allocator<char> local_2a0a;
  allocator<char> local_2a09;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a08;
  allocator<char> local_29ea;
  allocator<char> local_29e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_29e8;
  allocator<char> local_29ca;
  allocator<char> local_29c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_29c8;
  allocator<char> local_29aa;
  allocator<char> local_29a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_29a8;
  allocator<char> local_298a;
  allocator<char> local_2989;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2988;
  allocator<char> local_296a;
  allocator<char> local_2969;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2968;
  allocator<char> local_294b;
  allocator<char> local_294a;
  allocator_type local_2949;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2948;
  allocator<char> local_292a;
  allocator<char> local_2929;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2928;
  allocator<char> local_290a;
  allocator<char> local_2909;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2908;
  allocator<char> local_28ea;
  allocator<char> local_28e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_28e8;
  allocator<char> local_28ca;
  allocator<char> local_28c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_28c8;
  allocator<char> local_28aa;
  allocator<char> local_28a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_28a8;
  allocator<char> local_288a;
  allocator<char> local_2889;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2888;
  allocator<char> local_286a;
  allocator<char> local_2869;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2868;
  allocator<char> local_284a;
  allocator<char> local_2849;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2848;
  allocator<char> local_282a;
  allocator<char> local_2829;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2828;
  allocator<char> local_2802;
  allocator<char> local_2801;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2800;
  allocator<char> local_27e2;
  allocator<char> local_27e1;
  RPCResults local_27e0;
  allocator_type local_27c7;
  allocator<char> local_27c6;
  allocator_type local_27c5;
  allocator<char> local_27c4;
  allocator<char> local_27c3;
  allocator<char> local_27c2;
  allocator<char> local_27c1;
  vector<RPCArg,_std::allocator<RPCArg>_> local_27c0;
  allocator<char> local_27a8;
  allocator<char> local_27a7;
  allocator<char> local_27a6;
  allocator_type local_27a5;
  allocator<char> local_27a4;
  allocator<char> local_27a3;
  allocator<char> local_27a2;
  allocator<char> local_27a1;
  vector<RPCArg,_std::allocator<RPCArg>_> local_27a0;
  allocator<char> local_2782;
  allocator<char> local_2781;
  string local_2780;
  string local_2760;
  string local_2740;
  string local_2720;
  string local_2700;
  string local_26e0;
  string local_26c0;
  string local_26a0;
  string local_2680;
  string local_2660;
  string local_2640;
  string local_2620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25c0;
  char *local_25a0;
  size_type local_2598;
  char local_2590 [8];
  undefined8 uStack_2588;
  string local_2580 [32];
  string local_2560 [32];
  string local_2540 [32];
  string local_2520 [32];
  string local_2500 [32];
  string local_24e0 [32];
  string local_24c0 [32];
  string local_24a0 [32];
  string local_2480 [32];
  string local_2460 [32];
  string local_2440 [32];
  string local_2420 [32];
  string local_2400 [32];
  string local_23e0 [32];
  string local_23c0 [32];
  string local_23a0 [32];
  string local_2380 [32];
  string local_2360 [32];
  string local_2340 [32];
  string local_2320 [32];
  string local_2300 [32];
  string local_22e0 [32];
  string local_22c0 [32];
  string local_22a0 [32];
  string local_2280 [32];
  string local_2260 [32];
  string local_2240 [32];
  string local_2220 [32];
  string local_2200 [32];
  string local_21e0 [32];
  string local_21c0 [32];
  string local_21a0 [32];
  string local_2180 [32];
  string local_2160 [32];
  string local_2140 [32];
  string local_2120 [32];
  string local_2100 [32];
  string local_20e0 [32];
  string local_20c0 [32];
  string local_20a0 [32];
  string local_2080 [32];
  string local_2060 [32];
  string local_2040 [16];
  undefined8 local_2030;
  string local_2020 [32];
  string local_2000 [32];
  string local_1fe0 [32];
  string local_1fc0 [32];
  string local_1fa0 [32];
  string local_1f80 [32];
  string local_1f60 [32];
  string local_1f40 [32];
  string local_1f20 [32];
  string local_1f00 [32];
  string local_1ee0 [32];
  string local_1ec0 [32];
  string local_1ea0 [32];
  string local_1e80 [32];
  string local_1e60 [32];
  string local_1e40 [32];
  string local_1e20 [32];
  string local_1e00 [32];
  string local_1de0 [32];
  RPCResult local_1dc0 [4];
  RPCResult local_1ba0;
  string local_1b18 [32];
  string local_1af8 [32];
  string local_1ad8 [32];
  string local_1ab8 [32];
  string local_1a98 [32];
  string local_1a78 [32];
  string local_1a58 [32];
  string local_1a38 [32];
  string local_1a18 [32];
  string local_19f8 [32];
  RPCResult local_19d8 [4];
  RPCResult local_17b8;
  RPCResult local_1730;
  RPCResult local_16a8;
  RPCResult local_1620;
  RPCResult local_1598;
  RPCResult local_1510;
  RPCResult local_1488;
  RPCResult local_1400;
  RPCResult local_1378;
  RPCResult local_12f0;
  RPCResult local_1268;
  RPCResult local_11e0;
  RPCResult local_1158;
  RPCResult local_10d0;
  RPCResult local_1048;
  RPCResult local_fc0;
  RPCResult local_f38;
  RPCResult local_eb0;
  RPCResult local_e28;
  RPCResult local_da0;
  RPCResult local_d18;
  RPCResult local_c90;
  RPCResult local_c08;
  RPCResult local_b80;
  RPCResult local_af8;
  RPCResult local_a70;
  RPCResult local_9e8;
  string local_960 [32];
  string local_940 [32];
  RPCResult local_920;
  undefined1 local_898 [40];
  pointer pbStack_870;
  undefined2 uStack_868;
  undefined6 local_866;
  undefined2 uStack_860;
  undefined8 uStack_85e;
  RPCArgOptions local_850;
  string local_808 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_7e8;
  undefined1 local_790;
  string local_788 [32];
  RPCArgOptions local_768;
  string local_720 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_700;
  undefined1 local_6a8;
  string local_6a0 [32];
  RPCArg local_680 [2];
  string local_470 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_430;
  string local_3d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  string local_390 [32];
  RPCArgOptions local_370;
  string local_328 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_308;
  undefined1 local_2b0;
  string local_2a8 [32];
  RPCArg local_288 [2];
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_1048.m_key_name.field_2._M_allocated_capacity = 0;
  local_2030 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"getblockstats",&local_2781);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "\nCompute per block statistics for a given window. All amounts are in satoshis.\nIt won\'t work for some heights with pruning.\n"
             ,&local_2782);
  std::__cxx11::string::string<std::allocator<char>>(local_2a8,"hash_or_height",&local_27a1);
  local_308._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_2b0 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_328,"The block hash or height of the target block",&local_27a2);
  local_370.oneline_description._M_dataplus._M_p = (pointer)&local_370.oneline_description.field_2;
  local_370.skip_type_check = true;
  local_370.oneline_description._M_string_length = 0;
  local_370.oneline_description.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"",&local_27a3);
  std::__cxx11::string::string<std::allocator<char>>(local_390,"string or numeric",&local_27a4);
  __l._M_len = 2;
  __l._M_array = &local_3b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_370.type_str,__l,&local_27a5);
  local_370.hidden = false;
  local_370.also_positional = false;
  name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd32c;
  name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffd328;
  name._M_string_length = in_stack_ffffffffffffd330._0_8_;
  name.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )in_stack_ffffffffffffd330._8_16_;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffd350;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffd348;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffd358;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffd360;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffd368;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffd378;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffd380;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffd388;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffd390;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffd398;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffd3a0;
  description_37._M_string_length = in_stack_ffffffffffffd3b0;
  description_37._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd3a8;
  description_37.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd3b8;
  description_37.field_2._8_8_ = in_stack_ffffffffffffd3c0;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd3d0;
  opts._0_8_ = in_stack_ffffffffffffd3c8;
  opts.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffd3d8;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd3e0;
  opts.oneline_description.field_2._8_8_ = in_stack_ffffffffffffd3e8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd3f0;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffd3f8;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffd400;
  opts._64_8_ = in_stack_ffffffffffffd408;
  RPCArg::RPCArg(local_288,name,(Type)local_2a8,fallback,description_37,opts);
  std::__cxx11::string::string<std::allocator<char>>(local_3d0,"stats",&local_27a6);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_450,"all values",&local_27a7);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_430,&local_450);
  std::__cxx11::string::string<std::allocator<char>>
            (local_470,"Values to plot (see result below)",&local_27a8);
  std::__cxx11::string::string<std::allocator<char>>(local_6a0,"height",&local_27c1);
  local_700._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_6a8 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_720,"Selected statistic",&local_27c2);
  local_768.oneline_description._M_dataplus._M_p = (pointer)&local_768.oneline_description.field_2;
  local_768.skip_type_check = false;
  local_768.oneline_description._M_string_length = 0;
  local_768.oneline_description.field_2._M_local_buf[0] = '\0';
  local_768.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_768.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_768.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_768.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_768._58_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd32c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffd328;
  name_00._M_string_length = in_stack_ffffffffffffd330._0_8_;
  name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffd330._8_16_;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffd350;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffd348;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffd358;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffd360;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffd368;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffd378;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffd380;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffd388;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffd390;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffd398;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffd3a0;
  description_38._M_string_length = in_stack_ffffffffffffd3b0;
  description_38._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd3a8;
  description_38.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd3b8;
  description_38.field_2._8_8_ = in_stack_ffffffffffffd3c0;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd3d0;
  opts_00._0_8_ = in_stack_ffffffffffffd3c8;
  opts_00.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffd3d8;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd3e0;
  opts_00.oneline_description.field_2._8_8_ = in_stack_ffffffffffffd3e8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd3f0;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffd3f8;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffd400;
  opts_00._64_8_ = in_stack_ffffffffffffd408;
  RPCArg::RPCArg(local_680,name_00,(Type)local_6a0,fallback_00,description_38,opts_00);
  std::__cxx11::string::string<std::allocator<char>>(local_788,"time",&local_27c3);
  local_7e8._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_790 = 0;
  std::__cxx11::string::string<std::allocator<char>>(local_808,"Selected statistic",&local_27c4);
  local_850.oneline_description._M_dataplus._M_p = (pointer)&local_850.oneline_description.field_2;
  local_850.skip_type_check = false;
  local_850.oneline_description._M_string_length = 0;
  local_850.oneline_description.field_2._M_local_buf[0] = '\0';
  local_850.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_850.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_850.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_850.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_850._58_8_ = 0;
  name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd32c;
  name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffd328;
  name_01._M_string_length = in_stack_ffffffffffffd330._0_8_;
  name_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffd330._8_16_;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffd350;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffd348;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffd358;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffd360;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffd368;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffd378;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffd380;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffd388;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffd390;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffd398;
  fallback_01.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffd3a0;
  description_39._M_string_length = in_stack_ffffffffffffd3b0;
  description_39._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd3a8;
  description_39.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd3b8;
  description_39.field_2._8_8_ = in_stack_ffffffffffffd3c0;
  opts_01.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd3d0;
  opts_01._0_8_ = in_stack_ffffffffffffd3c8;
  opts_01.oneline_description._M_string_length = (size_type)in_stack_ffffffffffffd3d8;
  opts_01.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd3e0;
  opts_01.oneline_description.field_2._8_8_ = in_stack_ffffffffffffd3e8;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd3f0;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffd3f8;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffd400;
  opts_01._64_8_ = in_stack_ffffffffffffd408;
  RPCArg::RPCArg(local_680 + 1,name_01,(Type)local_788,fallback_01,description_39,opts_01);
  __l_00._M_len = 2;
  __l_00._M_array = local_680;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_27c0,__l_00,&local_27c5);
  local_898[0] = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_898 + 8),"stats",&local_27c6);
  _Var34._M_p = local_898;
  uStack_860 = 0;
  uStack_85e = 0;
  pbStack_870 = (pointer)0x0;
  uStack_868 = 0;
  local_866 = 0;
  name_02._M_string_length = in_stack_ffffffffffffd330._0_8_;
  name_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffd330._8_16_;
  name_02._M_dataplus._M_p = _Var34._M_p;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_ffffffffffffd350;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_ffffffffffffd348;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_8_ = in_stack_ffffffffffffd358;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _24_8_ = in_stack_ffffffffffffd360;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_16_ = in_stack_ffffffffffffd368;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_ffffffffffffd378;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_ffffffffffffd380;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_ffffffffffffd388;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_ffffffffffffd390;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_ffffffffffffd398;
  fallback_02.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_ffffffffffffd3a0;
  description_40._M_string_length = in_stack_ffffffffffffd3b0;
  description_40._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd3a8;
  description_40.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd3b8;
  description_40.field_2._8_8_ = in_stack_ffffffffffffd3c0;
  inner_36.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffd3d0;
  inner_36.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffd3c8;
  inner_36.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffd3d8;
  opts_02.oneline_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd3e8;
  opts_02._0_8_ = in_stack_ffffffffffffd3e0;
  opts_02.oneline_description._M_string_length = in_stack_ffffffffffffd3f0;
  opts_02.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd3f8;
  opts_02.oneline_description.field_2._8_8_ = in_stack_ffffffffffffd400;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd408;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffd410;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffd418;
  opts_02._64_8_ = in_stack_ffffffffffffd420;
  RPCArg::RPCArg(local_288 + 1,name_02,(Type)local_3d0,fallback_02,description_40,inner_36,opts_02);
  __l_01._M_len = 2;
  __l_01._M_array = local_288;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(&local_27a0,__l_01,&local_27c7);
  std::__cxx11::string::string<std::allocator<char>>(local_940,"",&local_27e1);
  std::__cxx11::string::string<std::allocator<char>>(local_960,"",&local_27e2);
  std::__cxx11::string::string<std::allocator<char>>(local_19f8,"avgfee",&local_2801);
  uVar35 = (undefined4)((ulong)_Var34._M_p >> 0x20);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a18,"Average fee in the block",&local_2802);
  local_2828.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2828.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2828.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar1._4_24_ = in_stack_ffffffffffffd330;
  auVar1._0_4_ = uVar35;
  auVar1._28_4_ = 0;
  description._M_string_length = in_stack_ffffffffffffd350;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffd378;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (local_19d8,NUM,(string)(auVar1 << 0x20),SUB81(local_19f8,0),description,inner,true);
  std::__cxx11::string::string<std::allocator<char>>(local_1a38,"avgfeerate",&local_2829);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a58,"Average feerate (in satoshis per virtual byte)",&local_282a);
  local_2848.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2848.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2848.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar2._4_24_ = in_stack_ffffffffffffd330;
  auVar2._0_4_ = uVar35;
  auVar2._28_4_ = 0;
  description_00._M_string_length = in_stack_ffffffffffffd350;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_00.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_00.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (local_19d8 + 1,NUM,(string)(auVar2 << 0x20),SUB81(local_1a38,0),description_00,inner_00
             ,true);
  std::__cxx11::string::string<std::allocator<char>>(local_1a78,"avgtxsize",&local_2849);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a98,"Average transaction size",&local_284a);
  local_2868.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2868.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2868.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar3._4_24_ = in_stack_ffffffffffffd330;
  auVar3._0_4_ = uVar35;
  auVar3._28_4_ = 0;
  description_01._M_string_length = in_stack_ffffffffffffd350;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_01.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_01.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (local_19d8 + 2,NUM,(string)(auVar3 << 0x20),SUB81(local_1a78,0),description_01,inner_01
             ,true);
  std::__cxx11::string::string<std::allocator<char>>(local_1ab8,"blockhash",&local_2869);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1ad8,"The block hash (to check for potential reorgs)",&local_286a);
  local_2888.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2888.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2888.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar33 = 0;
  auVar4._4_24_ = in_stack_ffffffffffffd330;
  auVar4._0_4_ = uVar35;
  auVar4._28_4_ = 0;
  description_02._M_string_length = in_stack_ffffffffffffd350;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_02.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_02.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (local_19d8 + 3,STR_HEX,(string)(auVar4 << 0x20),SUB81(local_1ab8,0),description_02,
             inner_02,true);
  std::__cxx11::string::string<std::allocator<char>>(local_1af8,"feerate_percentiles",&local_2889);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b18,
             "Feerates at the 10th, 25th, 50th, 75th, and 90th percentile weight unit (in satoshis per virtual byte)"
             ,&local_288a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1de0,"10th_percentile_feerate",&local_28a9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e00,"The 10th percentile feerate",&local_28aa);
  local_28c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = uVar35;
  m_key_name._M_dataplus._M_p._0_4_ = uVar33;
  m_key_name._M_string_length = in_stack_ffffffffffffd330._0_8_;
  m_key_name.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffd330._8_16_;
  description_03._M_string_length = in_stack_ffffffffffffd350;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_03.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_03.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult(local_1dc0,NUM,m_key_name,description_03,inner_03,SUB81(local_1de0,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e20,"25th_percentile_feerate",&local_28c9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e40,"The 25th percentile feerate",&local_28ca);
  local_28e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = uVar35;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar33;
  m_key_name_00._M_string_length = in_stack_ffffffffffffd330._0_8_;
  m_key_name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffd330._8_16_;
  description_04._M_string_length = in_stack_ffffffffffffd350;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_04.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_04.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult(local_1dc0 + 1,NUM,m_key_name_00,description_04,inner_04,SUB81(local_1e20,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e60,"50th_percentile_feerate",&local_28e9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e80,"The 50th percentile feerate",&local_28ea);
  local_2908.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2908.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2908.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = uVar35;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar33;
  m_key_name_01._M_string_length = in_stack_ffffffffffffd330._0_8_;
  m_key_name_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffd330._8_16_;
  description_05._M_string_length = in_stack_ffffffffffffd350;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_05.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult(local_1dc0 + 2,NUM,m_key_name_01,description_05,inner_05,SUB81(local_1e60,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1ea0,"75th_percentile_feerate",&local_2909);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1ec0,"The 75th percentile feerate",&local_290a);
  local_2928.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2928.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2928.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = uVar35;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar33;
  m_key_name_02._M_string_length = in_stack_ffffffffffffd330._0_8_;
  m_key_name_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffd330._8_16_;
  description_06._M_string_length = in_stack_ffffffffffffd350;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_06.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_06.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult(local_1dc0 + 3,NUM,m_key_name_02,description_06,inner_06,SUB81(local_1ea0,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1ee0,"90th_percentile_feerate",&local_2929);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f00,"The 90th percentile feerate",&local_292a);
  local_2948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = uVar35;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar33;
  m_key_name_03._M_string_length = in_stack_ffffffffffffd330._0_8_;
  m_key_name_03.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffd330._8_16_;
  description_07._M_string_length = in_stack_ffffffffffffd350;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_07.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_07.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult(&local_1ba0,NUM,m_key_name_03,description_07,inner_07,SUB81(local_1ee0,0));
  __l_02._M_len = 5;
  __l_02._M_array = local_1dc0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_28a8,__l_02,&local_2949);
  auVar5._4_24_ = in_stack_ffffffffffffd330;
  auVar5._0_4_ = uVar35;
  auVar5._28_4_ = 0;
  description_08._M_string_length = in_stack_ffffffffffffd350;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_08.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_08.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_17b8,ARR_FIXED,(string)(auVar5 << 0x20),SUB81(local_1af8,0),description_08,
             inner_08,true);
  std::__cxx11::string::string<std::allocator<char>>(local_1f20,"height",&local_294a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f40,"The height of the block",&local_294b);
  local_2968.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2968.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2968.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar6._4_24_ = in_stack_ffffffffffffd330;
  auVar6._0_4_ = uVar35;
  auVar6._28_4_ = 0;
  description_09._M_string_length = in_stack_ffffffffffffd350;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_09.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_09.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_1730,NUM,(string)(auVar6 << 0x20),SUB81(local_1f20,0),description_09,inner_09,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1f60,"ins",&local_2969);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f80,"The number of inputs (excluding coinbase)",&local_296a);
  local_2988.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2988.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2988.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar7._4_24_ = in_stack_ffffffffffffd330;
  auVar7._0_4_ = uVar35;
  auVar7._28_4_ = 0;
  description_10._M_string_length = in_stack_ffffffffffffd350;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_10.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_10.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_16a8,NUM,(string)(auVar7 << 0x20),SUB81(local_1f60,0),description_10,inner_10,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1fa0,"maxfee",&local_2989);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1fc0,"Maximum fee in the block",&local_298a);
  local_29a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_29a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_29a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar8._4_24_ = in_stack_ffffffffffffd330;
  auVar8._0_4_ = uVar35;
  auVar8._28_4_ = 0;
  description_11._M_string_length = in_stack_ffffffffffffd350;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_11.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_11.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_1620,NUM,(string)(auVar8 << 0x20),SUB81(local_1fa0,0),description_11,inner_11,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1fe0,"maxfeerate",&local_29a9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2000,"Maximum feerate (in satoshis per virtual byte)",&local_29aa);
  local_29c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_29c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_29c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar9._4_24_ = in_stack_ffffffffffffd330;
  auVar9._0_4_ = uVar35;
  auVar9._28_4_ = 0;
  description_12._M_string_length = in_stack_ffffffffffffd350;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_12.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_12.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_1598,NUM,(string)(auVar9 << 0x20),SUB81(local_1fe0,0),description_12,inner_12,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_2020,"maxtxsize",&local_29c9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2040,"Maximum transaction size",&local_29ca);
  local_29e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_29e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_29e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar10._4_24_ = in_stack_ffffffffffffd330;
  auVar10._0_4_ = uVar35;
  auVar10._28_4_ = 0;
  description_13._M_string_length = in_stack_ffffffffffffd350;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_13.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_13.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_1510,NUM,(string)(auVar10 << 0x20),SUB81(local_2020,0),description_13,inner_13,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_2060,"medianfee",&local_29e9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2080,"Truncated median fee in the block",&local_29ea);
  local_2a08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar11._4_24_ = in_stack_ffffffffffffd330;
  auVar11._0_4_ = uVar35;
  auVar11._28_4_ = 0;
  description_14._M_string_length = in_stack_ffffffffffffd350;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_14.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_14.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_1488,NUM,(string)(auVar11 << 0x20),SUB81(local_2060,0),description_14,inner_14,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_20a0,"mediantime",&local_2a09);
  std::__cxx11::string::string<std::allocator<char>>
            (local_20c0,"The block median time past",&local_2a0a);
  local_2a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar12._4_24_ = in_stack_ffffffffffffd330;
  auVar12._0_4_ = uVar35;
  auVar12._28_4_ = 0;
  description_15._M_string_length = in_stack_ffffffffffffd350;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_15.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_15.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_1400,NUM,(string)(auVar12 << 0x20),SUB81(local_20a0,0),description_15,inner_15,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_20e0,"mediantxsize",&local_2a29);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2100,"Truncated median transaction size",&local_2a2a);
  local_2a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar13._4_24_ = in_stack_ffffffffffffd330;
  auVar13._0_4_ = uVar35;
  auVar13._28_4_ = 0;
  description_16._M_string_length = in_stack_ffffffffffffd350;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_16.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_16.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_1378,NUM,(string)(auVar13 << 0x20),SUB81(local_20e0,0),description_16,inner_16,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_2120,"minfee",&local_2a49);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2140,"Minimum fee in the block",&local_2a4a);
  local_2a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar14._4_24_ = in_stack_ffffffffffffd330;
  auVar14._0_4_ = uVar35;
  auVar14._28_4_ = 0;
  description_17._M_string_length = in_stack_ffffffffffffd350;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_17.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_17.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_12f0,NUM,(string)(auVar14 << 0x20),SUB81(local_2120,0),description_17,inner_17,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_2160,"minfeerate",&local_2a69);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2180,"Minimum feerate (in satoshis per virtual byte)",&local_2a6a);
  local_2a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar15._4_24_ = in_stack_ffffffffffffd330;
  auVar15._0_4_ = uVar35;
  auVar15._28_4_ = 0;
  description_18._M_string_length = in_stack_ffffffffffffd350;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_18.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_18.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_1268,NUM,(string)(auVar15 << 0x20),SUB81(local_2160,0),description_18,inner_18,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_21a0,"mintxsize",&local_2a89);
  std::__cxx11::string::string<std::allocator<char>>
            (local_21c0,"Minimum transaction size",&local_2a8a);
  local_2aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar16._4_24_ = in_stack_ffffffffffffd330;
  auVar16._0_4_ = uVar35;
  auVar16._28_4_ = 0;
  description_19._M_string_length = in_stack_ffffffffffffd350;
  description_19._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_19.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_19.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_11e0,NUM,(string)(auVar16 << 0x20),SUB81(local_21a0,0),description_19,inner_19,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_21e0,"outs",&local_2aa9);
  std::__cxx11::string::string<std::allocator<char>>(local_2200,"The number of outputs",&local_2aaa)
  ;
  local_2ac8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2ac8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2ac8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar17._4_24_ = in_stack_ffffffffffffd330;
  auVar17._0_4_ = uVar35;
  auVar17._28_4_ = 0;
  description_20._M_string_length = in_stack_ffffffffffffd350;
  description_20._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_20.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_20.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_1158,NUM,(string)(auVar17 << 0x20),SUB81(local_21e0,0),description_20,inner_20,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_2220,"subsidy",&local_2ac9);
  std::__cxx11::string::string<std::allocator<char>>(local_2240,"The block subsidy",&local_2aca);
  local_2ae8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2ae8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2ae8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar18._4_24_ = in_stack_ffffffffffffd330;
  auVar18._0_4_ = uVar35;
  auVar18._28_4_ = 0;
  description_21._M_string_length = in_stack_ffffffffffffd350;
  description_21._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_21.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_21.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_10d0,NUM,(string)(auVar18 << 0x20),SUB81(local_2220,0),description_21,inner_21,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_2260,"swtotal_size",&local_2ae9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2280,"Total size of all segwit transactions",&local_2aea);
  local_2b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar19._4_24_ = in_stack_ffffffffffffd330;
  auVar19._0_4_ = uVar35;
  auVar19._28_4_ = 0;
  description_22._M_string_length = in_stack_ffffffffffffd350;
  description_22._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_22.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_22.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_1048,NUM,(string)(auVar19 << 0x20),SUB81(local_2260,0),description_22,inner_22,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_22a0,"swtotal_weight",&local_2b09);
  std::__cxx11::string::string<std::allocator<char>>
            (local_22c0,"Total weight of all segwit transactions",&local_2b0a);
  local_2b28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar20._4_24_ = in_stack_ffffffffffffd330;
  auVar20._0_4_ = uVar35;
  auVar20._28_4_ = 0;
  description_23._M_string_length = in_stack_ffffffffffffd350;
  description_23._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_23.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_23.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_fc0,NUM,(string)(auVar20 << 0x20),SUB81(local_22a0,0),description_23,inner_23,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_22e0,"swtxs",&local_2b29);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2300,"The number of segwit transactions",&local_2b2a);
  local_2b48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar21._4_24_ = in_stack_ffffffffffffd330;
  auVar21._0_4_ = uVar35;
  auVar21._28_4_ = 0;
  description_24._M_string_length = in_stack_ffffffffffffd350;
  description_24._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_24.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_24.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_f38,NUM,(string)(auVar21 << 0x20),SUB81(local_22e0,0),description_24,inner_24,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_2320,"time",&local_2b49);
  std::__cxx11::string::string<std::allocator<char>>(local_2340,"The block time",&local_2b4a);
  local_2b68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar22._4_24_ = in_stack_ffffffffffffd330;
  auVar22._0_4_ = uVar35;
  auVar22._28_4_ = 0;
  description_25._M_string_length = in_stack_ffffffffffffd350;
  description_25._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_25.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_25.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_eb0,NUM,(string)(auVar22 << 0x20),SUB81(local_2320,0),description_25,inner_25,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_2360,"total_out",&local_2b69);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2380,
             "Total amount in all outputs (excluding coinbase and thus reward [ie subsidy + totalfee])"
             ,&local_2b6a);
  local_2b88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar23._4_24_ = in_stack_ffffffffffffd330;
  auVar23._0_4_ = uVar35;
  auVar23._28_4_ = 0;
  description_26._M_string_length = in_stack_ffffffffffffd350;
  description_26._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_26.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_26.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_e28,NUM,(string)(auVar23 << 0x20),SUB81(local_2360,0),description_26,inner_26,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_23a0,"total_size",&local_2b89);
  std::__cxx11::string::string<std::allocator<char>>
            (local_23c0,"Total size of all non-coinbase transactions",&local_2b8a);
  local_2ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar24._4_24_ = in_stack_ffffffffffffd330;
  auVar24._0_4_ = uVar35;
  auVar24._28_4_ = 0;
  description_27._M_string_length = in_stack_ffffffffffffd350;
  description_27._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_27.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_27.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_da0,NUM,(string)(auVar24 << 0x20),SUB81(local_23a0,0),description_27,inner_27,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_23e0,"total_weight",&local_2ba9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2400,"Total weight of all non-coinbase transactions",&local_2baa);
  local_2bc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2bc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2bc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar25._4_24_ = in_stack_ffffffffffffd330;
  auVar25._0_4_ = uVar35;
  auVar25._28_4_ = 0;
  description_28._M_string_length = in_stack_ffffffffffffd350;
  description_28._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_28.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_28.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_d18,NUM,(string)(auVar25 << 0x20),SUB81(local_23e0,0),description_28,inner_28,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_2420,"totalfee",&local_2bc9);
  std::__cxx11::string::string<std::allocator<char>>(local_2440,"The fee total",&local_2bca);
  auVar26._4_24_ = in_stack_ffffffffffffd330;
  auVar26._0_4_ = uVar35;
  auVar26._28_4_ = 0;
  description_29._M_string_length = in_stack_ffffffffffffd350;
  description_29._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_29.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_29.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_c90,NUM,(string)(auVar26 << 0x20),SUB81(local_2420,0),description_29,inner_29,
             true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2460,"txs",(allocator<char> *)&stack0xffffffffffffd417);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2480,"The number of transactions (including coinbase)",
             (allocator<char> *)&stack0xffffffffffffd416);
  auVar27._4_24_ = in_stack_ffffffffffffd330;
  auVar27._0_4_ = uVar35;
  auVar27._28_4_ = 0;
  description_30._M_string_length = in_stack_ffffffffffffd350;
  description_30._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_30.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_30.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_c08,NUM,(string)(auVar27 << 0x20),SUB81(local_2460,0),description_30,inner_30,
             true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_24a0,"utxo_increase",(allocator<char> *)&stack0xffffffffffffd3f7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_24c0,
             "The increase/decrease in the number of unspent outputs (not discounting op_return and similar)"
             ,(allocator<char> *)&stack0xffffffffffffd3f6);
  auVar28._4_24_ = in_stack_ffffffffffffd330;
  auVar28._0_4_ = uVar35;
  auVar28._28_4_ = 0;
  description_31._M_string_length = in_stack_ffffffffffffd350;
  description_31._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_31.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_31.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_31.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_31.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_31.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_b80,NUM,(string)(auVar28 << 0x20),SUB81(local_24a0,0),description_31,inner_31,
             true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_24e0,"utxo_size_inc",(allocator<char> *)&stack0xffffffffffffd3d7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2500,
             "The increase/decrease in size for the utxo index (not discounting op_return and similar)"
             ,(allocator<char> *)&stack0xffffffffffffd3d6);
  pRVar42 = (pointer)0x0;
  pRVar43 = (pointer)0x0;
  pRVar44 = (pointer)0x0;
  auVar29._4_24_ = in_stack_ffffffffffffd330;
  auVar29._0_4_ = uVar35;
  auVar29._28_4_ = 0;
  description_32._M_string_length = in_stack_ffffffffffffd350;
  description_32._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_32.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_32.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_32.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_32.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_32.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_af8,NUM,(string)(auVar29 << 0x20),SUB81(local_24e0,0),description_32,inner_32,
             true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2520,"utxo_increase_actual",(allocator<char> *)&stack0xffffffffffffd3b7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2540,
             "The increase/decrease in the number of unspent outputs, not counting unspendables",
             (allocator<char> *)&stack0xffffffffffffd3b6);
  pRVar39 = (pointer)0x0;
  pRVar40 = (pointer)0x0;
  pRVar41 = (pointer)0x0;
  auVar30._4_24_ = in_stack_ffffffffffffd330;
  auVar30._0_4_ = uVar35;
  auVar30._28_4_ = 0;
  description_33._M_string_length = in_stack_ffffffffffffd350;
  description_33._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_33.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_33.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_33.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd378;
  inner_33.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_33.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_a70,NUM,(string)(auVar30 << 0x20),SUB81(local_2520,0),description_33,inner_33,
             true);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2560,"utxo_size_inc_actual",(allocator<char> *)&stack0xffffffffffffd397);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2580,
             "The increase/decrease in size for the utxo index, not counting unspendables",
             (allocator<char> *)&stack0xffffffffffffd396);
  pRVar36 = (pointer)0x0;
  pRVar37 = (pointer)0x0;
  pRVar38 = (pointer)0x0;
  uVar33 = 0;
  auVar31._4_24_ = in_stack_ffffffffffffd330;
  auVar31._0_4_ = uVar35;
  auVar31._28_4_ = 0;
  description_34._M_string_length = in_stack_ffffffffffffd350;
  description_34._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_34.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_34.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_34.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_34.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_34.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult
            (&local_9e8,NUM,(string)(auVar31 << 0x20),SUB81(local_2560,0),description_34,inner_34,
             true);
  __l_03._M_len = 0x1f;
  __l_03._M_array = local_19d8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_2800,__l_03,(allocator_type *)&stack0xffffffffffffd377);
  m_key_name_04._M_dataplus._M_p._4_4_ = uVar35;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar33;
  m_key_name_04._M_string_length = in_stack_ffffffffffffd330._0_8_;
  m_key_name_04.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffd330._8_16_;
  description_35._M_string_length = in_stack_ffffffffffffd350;
  description_35._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd348;
  description_35.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffd358;
  description_35.field_2._8_8_ = in_stack_ffffffffffffd360;
  inner_35.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar36;
  inner_35.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_ffffffffffffd368._0_8_;
  inner_35.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_ffffffffffffd368._8_8_;
  RPCResult::RPCResult(&local_920,OBJ,m_key_name_04,description_35,inner_35,SUB81(local_940,0));
  result._4_4_ = uVar35;
  result.m_type = uVar33;
  result.m_key_name._0_24_ = in_stack_ffffffffffffd330;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffd348;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd350;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffd358;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffd360;
  result.m_optional = (bool)in_stack_ffffffffffffd368[0];
  result.m_skip_type_check = (bool)in_stack_ffffffffffffd368[1];
  result._66_6_ = in_stack_ffffffffffffd368._2_6_;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd368._8_8_;
  result.m_description._M_string_length = (size_type)pRVar36;
  result.m_description.field_2._M_allocated_capacity = (size_type)pRVar37;
  result.m_description.field_2._8_8_ = pRVar38;
  result.m_cond._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd390;
  result.m_cond._M_string_length = (size_type)pRVar39;
  result.m_cond.field_2._M_allocated_capacity = (size_type)pRVar40;
  result.m_cond.field_2._8_8_ = pRVar41;
  RPCResults::RPCResults(&local_27e0,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2640,"getblockstats",(allocator<char> *)&stack0xffffffffffffd376);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2660,
             "\'\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\"\' \'[\"minfeerate\",\"avgfeerate\"]\'"
             ,(allocator<char> *)&stack0xffffffffffffd375);
  HelpExampleCli(&local_2620,&local_2640,&local_2660);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_26a0,"getblockstats",(allocator<char> *)&stack0xffffffffffffd374);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_26c0,"1000 \'[\"minfeerate\",\"avgfeerate\"]\'",
             (allocator<char> *)&stack0xffffffffffffd373);
  HelpExampleCli(&local_2680,&local_26a0,&local_26c0);
  std::operator+(&local_2600,&local_2620,&local_2680);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2700,"getblockstats",(allocator<char> *)&stack0xffffffffffffd372);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2720,
             "\"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09\", [\"minfeerate\",\"avgfeerate\"]"
             ,(allocator<char> *)&stack0xffffffffffffd371);
  HelpExampleRpc(&local_26e0,&local_2700,&local_2720);
  std::operator+(&local_25e0,&local_2600,&local_26e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2760,"getblockstats",(allocator<char> *)&stack0xffffffffffffd370);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2780,"1000, [\"minfeerate\",\"avgfeerate\"]",
             (allocator<char> *)&stack0xffffffffffffd36f);
  HelpExampleRpc(&local_2740,&local_2760,&local_2780);
  std::operator+(&local_25c0,&local_25e0,&local_2740);
  local_25a0 = local_2590;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_25c0._M_dataplus._M_p == &local_25c0.field_2) {
    uStack_2588 = local_25c0.field_2._8_8_;
  }
  else {
    local_25a0 = local_25c0._M_dataplus._M_p;
  }
  local_2598 = local_25c0._M_string_length;
  local_25c0._M_string_length = 0;
  local_25c0.field_2._M_local_buf[0] = '\0';
  name_03._M_string_length = in_stack_ffffffffffffd330._0_8_;
  name_03.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffd330._8_16_;
  name_03._M_dataplus._M_p = &stack0xffffffffffffd348;
  description_36.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:1898:9)>
       ::_M_manager;
  description_36._M_dataplus._M_p = (pointer)0x0;
  description_36._M_string_length = 0;
  description_36.field_2._8_8_ =
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/blockchain.cpp:1898:9)>
       ::_M_invoke;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar36;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffd368._0_8_;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffd368._8_8_;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar38;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = pRVar37;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffd390;
  examples.m_examples._M_string_length = (size_type)pRVar40;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar39;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar41;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffd3b0;
  fun.super__Function_base._M_functor._8_8_ = pRVar43;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar42;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar44;
  fun._M_invoker = in_stack_ffffffffffffd3d0;
  local_25c0._M_dataplus._M_p = (pointer)&local_25c0.field_2;
  RPCHelpMan::RPCHelpMan(in_RDI,name_03,description_36,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffd348);
  std::__cxx11::string::~string((string *)&local_25a0);
  std::__cxx11::string::~string((string *)&local_25c0);
  std::__cxx11::string::~string((string *)&local_2740);
  std::__cxx11::string::~string((string *)&local_2780);
  std::__cxx11::string::~string((string *)&local_2760);
  std::__cxx11::string::~string((string *)&local_25e0);
  std::__cxx11::string::~string((string *)&local_26e0);
  std::__cxx11::string::~string((string *)&local_2720);
  std::__cxx11::string::~string((string *)&local_2700);
  std::__cxx11::string::~string((string *)&local_2600);
  std::__cxx11::string::~string((string *)&local_2680);
  std::__cxx11::string::~string((string *)&local_26c0);
  std::__cxx11::string::~string((string *)&local_26a0);
  std::__cxx11::string::~string((string *)&local_2620);
  std::__cxx11::string::~string((string *)&local_2660);
  std::__cxx11::string::~string((string *)&local_2640);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_27e0.m_results);
  RPCResult::~RPCResult(&local_920);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2800);
  lVar32 = 0xff0;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_19d8[0].m_type + lVar32));
    lVar32 = lVar32 + -0x88;
  } while (lVar32 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd378);
  std::__cxx11::string::~string(local_2580);
  std::__cxx11::string::~string(local_2560);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd398);
  std::__cxx11::string::~string(local_2540);
  std::__cxx11::string::~string(local_2520);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd3b8);
  std::__cxx11::string::~string(local_2500);
  std::__cxx11::string::~string(local_24e0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd3d8);
  std::__cxx11::string::~string(local_24c0);
  std::__cxx11::string::~string(local_24a0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd3f8);
  std::__cxx11::string::~string(local_2480);
  std::__cxx11::string::~string(local_2460);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd418);
  std::__cxx11::string::~string(local_2440);
  std::__cxx11::string::~string(local_2420);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2bc8);
  std::__cxx11::string::~string(local_2400);
  std::__cxx11::string::~string(local_23e0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2ba8);
  std::__cxx11::string::~string(local_23c0);
  std::__cxx11::string::~string(local_23a0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b88);
  std::__cxx11::string::~string(local_2380);
  std::__cxx11::string::~string(local_2360);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b68);
  std::__cxx11::string::~string(local_2340);
  std::__cxx11::string::~string(local_2320);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b48);
  std::__cxx11::string::~string(local_2300);
  std::__cxx11::string::~string(local_22e0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b28);
  std::__cxx11::string::~string(local_22c0);
  std::__cxx11::string::~string(local_22a0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b08);
  std::__cxx11::string::~string(local_2280);
  std::__cxx11::string::~string(local_2260);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2ae8);
  std::__cxx11::string::~string(local_2240);
  std::__cxx11::string::~string(local_2220);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2ac8);
  std::__cxx11::string::~string(local_2200);
  std::__cxx11::string::~string(local_21e0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2aa8);
  std::__cxx11::string::~string(local_21c0);
  std::__cxx11::string::~string(local_21a0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a88);
  std::__cxx11::string::~string(local_2180);
  std::__cxx11::string::~string(local_2160);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a68);
  std::__cxx11::string::~string(local_2140);
  std::__cxx11::string::~string(local_2120);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a48);
  std::__cxx11::string::~string(local_2100);
  std::__cxx11::string::~string(local_20e0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a28);
  std::__cxx11::string::~string(local_20c0);
  std::__cxx11::string::~string(local_20a0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a08);
  std::__cxx11::string::~string(local_2080);
  std::__cxx11::string::~string(local_2060);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_29e8);
  std::__cxx11::string::~string(local_2040);
  std::__cxx11::string::~string(local_2020);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_29c8);
  std::__cxx11::string::~string(local_2000);
  std::__cxx11::string::~string(local_1fe0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_29a8);
  std::__cxx11::string::~string(local_1fc0);
  std::__cxx11::string::~string(local_1fa0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2988);
  std::__cxx11::string::~string(local_1f80);
  std::__cxx11::string::~string(local_1f60);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2968);
  std::__cxx11::string::~string(local_1f40);
  std::__cxx11::string::~string(local_1f20);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_28a8);
  lVar32 = 0x220;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_1dc0[0].m_type + lVar32));
    lVar32 = lVar32 + -0x88;
  } while (lVar32 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2948);
  std::__cxx11::string::~string(local_1f00);
  std::__cxx11::string::~string(local_1ee0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2928);
  std::__cxx11::string::~string(local_1ec0);
  std::__cxx11::string::~string(local_1ea0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2908);
  std::__cxx11::string::~string(local_1e80);
  std::__cxx11::string::~string(local_1e60);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_28e8);
  std::__cxx11::string::~string(local_1e40);
  std::__cxx11::string::~string(local_1e20);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_28c8);
  std::__cxx11::string::~string(local_1e00);
  std::__cxx11::string::~string(local_1de0);
  std::__cxx11::string::~string(local_1b18);
  std::__cxx11::string::~string(local_1af8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2888);
  std::__cxx11::string::~string(local_1ad8);
  std::__cxx11::string::~string(local_1ab8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2868);
  std::__cxx11::string::~string(local_1a98);
  std::__cxx11::string::~string(local_1a78);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2848);
  std::__cxx11::string::~string(local_1a58);
  std::__cxx11::string::~string(local_1a38);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2828);
  std::__cxx11::string::~string(local_1a18);
  std::__cxx11::string::~string(local_19f8);
  std::__cxx11::string::~string(local_960);
  std::__cxx11::string::~string(local_940);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_27a0);
  lVar32 = 0x108;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_288[0].m_names._M_dataplus._M_p + lVar32));
    lVar32 = lVar32 + -0x108;
  } while (lVar32 != -0x108);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)local_898);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_27c0);
  lVar32 = 0x108;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_680[0].m_names._M_dataplus._M_p + lVar32));
    lVar32 = lVar32 + -0x108;
  } while (lVar32 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_850);
  std::__cxx11::string::~string(local_808);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_7e8._M_first);
  std::__cxx11::string::~string(local_788);
  RPCArgOptions::~RPCArgOptions(&local_768);
  std::__cxx11::string::~string(local_720);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_700._M_first);
  std::__cxx11::string::~string(local_6a0);
  std::__cxx11::string::~string(local_470);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string(local_3d0);
  RPCArgOptions::~RPCArgOptions(&local_370);
  lVar32 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_3b0._M_dataplus._M_p + lVar32));
    lVar32 = lVar32 + -0x20;
  } while (lVar32 != -0x20);
  std::__cxx11::string::~string(local_328);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_308._M_first);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getblockstats()
{
    return RPCHelpMan{"getblockstats",
                "\nCompute per block statistics for a given window. All amounts are in satoshis.\n"
                "It won't work for some heights with pruning.\n",
                {
                    {"hash_or_height", RPCArg::Type::NUM, RPCArg::Optional::NO, "The block hash or height of the target block",
                     RPCArgOptions{
                         .skip_type_check = true,
                         .type_str = {"", "string or numeric"},
                     }},
                    {"stats", RPCArg::Type::ARR, RPCArg::DefaultHint{"all values"}, "Values to plot (see result below)",
                        {
                            {"height", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "Selected statistic"},
                            {"time", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "Selected statistic"},
                        },
                        RPCArgOptions{.oneline_description="stats"}},
                },
                RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::NUM, "avgfee", /*optional=*/true, "Average fee in the block"},
                {RPCResult::Type::NUM, "avgfeerate", /*optional=*/true, "Average feerate (in satoshis per virtual byte)"},
                {RPCResult::Type::NUM, "avgtxsize", /*optional=*/true, "Average transaction size"},
                {RPCResult::Type::STR_HEX, "blockhash", /*optional=*/true, "The block hash (to check for potential reorgs)"},
                {RPCResult::Type::ARR_FIXED, "feerate_percentiles", /*optional=*/true, "Feerates at the 10th, 25th, 50th, 75th, and 90th percentile weight unit (in satoshis per virtual byte)",
                {
                    {RPCResult::Type::NUM, "10th_percentile_feerate", "The 10th percentile feerate"},
                    {RPCResult::Type::NUM, "25th_percentile_feerate", "The 25th percentile feerate"},
                    {RPCResult::Type::NUM, "50th_percentile_feerate", "The 50th percentile feerate"},
                    {RPCResult::Type::NUM, "75th_percentile_feerate", "The 75th percentile feerate"},
                    {RPCResult::Type::NUM, "90th_percentile_feerate", "The 90th percentile feerate"},
                }},
                {RPCResult::Type::NUM, "height", /*optional=*/true, "The height of the block"},
                {RPCResult::Type::NUM, "ins", /*optional=*/true, "The number of inputs (excluding coinbase)"},
                {RPCResult::Type::NUM, "maxfee", /*optional=*/true, "Maximum fee in the block"},
                {RPCResult::Type::NUM, "maxfeerate", /*optional=*/true, "Maximum feerate (in satoshis per virtual byte)"},
                {RPCResult::Type::NUM, "maxtxsize", /*optional=*/true, "Maximum transaction size"},
                {RPCResult::Type::NUM, "medianfee", /*optional=*/true, "Truncated median fee in the block"},
                {RPCResult::Type::NUM, "mediantime", /*optional=*/true, "The block median time past"},
                {RPCResult::Type::NUM, "mediantxsize", /*optional=*/true, "Truncated median transaction size"},
                {RPCResult::Type::NUM, "minfee", /*optional=*/true, "Minimum fee in the block"},
                {RPCResult::Type::NUM, "minfeerate", /*optional=*/true, "Minimum feerate (in satoshis per virtual byte)"},
                {RPCResult::Type::NUM, "mintxsize", /*optional=*/true, "Minimum transaction size"},
                {RPCResult::Type::NUM, "outs", /*optional=*/true, "The number of outputs"},
                {RPCResult::Type::NUM, "subsidy", /*optional=*/true, "The block subsidy"},
                {RPCResult::Type::NUM, "swtotal_size", /*optional=*/true, "Total size of all segwit transactions"},
                {RPCResult::Type::NUM, "swtotal_weight", /*optional=*/true, "Total weight of all segwit transactions"},
                {RPCResult::Type::NUM, "swtxs", /*optional=*/true, "The number of segwit transactions"},
                {RPCResult::Type::NUM, "time", /*optional=*/true, "The block time"},
                {RPCResult::Type::NUM, "total_out", /*optional=*/true, "Total amount in all outputs (excluding coinbase and thus reward [ie subsidy + totalfee])"},
                {RPCResult::Type::NUM, "total_size", /*optional=*/true, "Total size of all non-coinbase transactions"},
                {RPCResult::Type::NUM, "total_weight", /*optional=*/true, "Total weight of all non-coinbase transactions"},
                {RPCResult::Type::NUM, "totalfee", /*optional=*/true, "The fee total"},
                {RPCResult::Type::NUM, "txs", /*optional=*/true, "The number of transactions (including coinbase)"},
                {RPCResult::Type::NUM, "utxo_increase", /*optional=*/true, "The increase/decrease in the number of unspent outputs (not discounting op_return and similar)"},
                {RPCResult::Type::NUM, "utxo_size_inc", /*optional=*/true, "The increase/decrease in size for the utxo index (not discounting op_return and similar)"},
                {RPCResult::Type::NUM, "utxo_increase_actual", /*optional=*/true, "The increase/decrease in the number of unspent outputs, not counting unspendables"},
                {RPCResult::Type::NUM, "utxo_size_inc_actual", /*optional=*/true, "The increase/decrease in size for the utxo index, not counting unspendables"},
            }},
                RPCExamples{
                    HelpExampleCli("getblockstats", R"('"00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09"' '["minfeerate","avgfeerate"]')") +
                    HelpExampleCli("getblockstats", R"(1000 '["minfeerate","avgfeerate"]')") +
                    HelpExampleRpc("getblockstats", R"("00000000c937983704a73af28acdec37b049d214adbda81d7e2a3dd146f6ed09", ["minfeerate","avgfeerate"])") +
                    HelpExampleRpc("getblockstats", R"(1000, ["minfeerate","avgfeerate"])")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    ChainstateManager& chainman = EnsureAnyChainman(request.context);
    const CBlockIndex& pindex{*CHECK_NONFATAL(ParseHashOrHeight(request.params[0], chainman))};

    std::set<std::string> stats;
    if (!request.params[1].isNull()) {
        const UniValue stats_univalue = request.params[1].get_array();
        for (unsigned int i = 0; i < stats_univalue.size(); i++) {
            const std::string stat = stats_univalue[i].get_str();
            stats.insert(stat);
        }
    }

    const CBlock& block = GetBlockChecked(chainman.m_blockman, pindex);
    const CBlockUndo& blockUndo = GetUndoChecked(chainman.m_blockman, pindex);

    const bool do_all = stats.size() == 0; // Calculate everything if nothing selected (default)
    const bool do_mediantxsize = do_all || stats.count("mediantxsize") != 0;
    const bool do_medianfee = do_all || stats.count("medianfee") != 0;
    const bool do_feerate_percentiles = do_all || stats.count("feerate_percentiles") != 0;
    const bool loop_inputs = do_all || do_medianfee || do_feerate_percentiles ||
        SetHasKeys(stats, "utxo_increase", "utxo_increase_actual", "utxo_size_inc", "utxo_size_inc_actual", "totalfee", "avgfee", "avgfeerate", "minfee", "maxfee", "minfeerate", "maxfeerate");
    const bool loop_outputs = do_all || loop_inputs || stats.count("total_out");
    const bool do_calculate_size = do_mediantxsize ||
        SetHasKeys(stats, "total_size", "avgtxsize", "mintxsize", "maxtxsize", "swtotal_size");
    const bool do_calculate_weight = do_all || SetHasKeys(stats, "total_weight", "avgfeerate", "swtotal_weight", "avgfeerate", "feerate_percentiles", "minfeerate", "maxfeerate");
    const bool do_calculate_sw = do_all || SetHasKeys(stats, "swtxs", "swtotal_size", "swtotal_weight");

    CAmount maxfee = 0;
    CAmount maxfeerate = 0;
    CAmount minfee = MAX_MONEY;
    CAmount minfeerate = MAX_MONEY;
    CAmount total_out = 0;
    CAmount totalfee = 0;
    int64_t inputs = 0;
    int64_t maxtxsize = 0;
    int64_t mintxsize = MAX_BLOCK_SERIALIZED_SIZE;
    int64_t outputs = 0;
    int64_t swtotal_size = 0;
    int64_t swtotal_weight = 0;
    int64_t swtxs = 0;
    int64_t total_size = 0;
    int64_t total_weight = 0;
    int64_t utxos = 0;
    int64_t utxo_size_inc = 0;
    int64_t utxo_size_inc_actual = 0;
    std::vector<CAmount> fee_array;
    std::vector<std::pair<CAmount, int64_t>> feerate_array;
    std::vector<int64_t> txsize_array;

    for (size_t i = 0; i < block.vtx.size(); ++i) {
        const auto& tx = block.vtx.at(i);
        outputs += tx->vout.size();

        CAmount tx_total_out = 0;
        if (loop_outputs) {
            for (const CTxOut& out : tx->vout) {
                tx_total_out += out.nValue;

                size_t out_size = GetSerializeSize(out) + PER_UTXO_OVERHEAD;
                utxo_size_inc += out_size;

                // The Genesis block and the repeated BIP30 block coinbases don't change the UTXO
                // set counts, so they have to be excluded from the statistics
                if (pindex.nHeight == 0 || (IsBIP30Repeat(pindex) && tx->IsCoinBase())) continue;
                // Skip unspendable outputs since they are not included in the UTXO set
                if (out.scriptPubKey.IsUnspendable()) continue;

                ++utxos;
                utxo_size_inc_actual += out_size;
            }
        }

        if (tx->IsCoinBase()) {
            continue;
        }

        inputs += tx->vin.size(); // Don't count coinbase's fake input
        total_out += tx_total_out; // Don't count coinbase reward

        int64_t tx_size = 0;
        if (do_calculate_size) {

            tx_size = tx->GetTotalSize();
            if (do_mediantxsize) {
                txsize_array.push_back(tx_size);
            }
            maxtxsize = std::max(maxtxsize, tx_size);
            mintxsize = std::min(mintxsize, tx_size);
            total_size += tx_size;
        }

        int64_t weight = 0;
        if (do_calculate_weight) {
            weight = GetTransactionWeight(*tx);
            total_weight += weight;
        }

        if (do_calculate_sw && tx->HasWitness()) {
            ++swtxs;
            swtotal_size += tx_size;
            swtotal_weight += weight;
        }

        if (loop_inputs) {
            CAmount tx_total_in = 0;
            const auto& txundo = blockUndo.vtxundo.at(i - 1);
            for (const Coin& coin: txundo.vprevout) {
                const CTxOut& prevoutput = coin.out;

                tx_total_in += prevoutput.nValue;
                size_t prevout_size = GetSerializeSize(prevoutput) + PER_UTXO_OVERHEAD;
                utxo_size_inc -= prevout_size;
                utxo_size_inc_actual -= prevout_size;
            }

            CAmount txfee = tx_total_in - tx_total_out;
            CHECK_NONFATAL(MoneyRange(txfee));
            if (do_medianfee) {
                fee_array.push_back(txfee);
            }
            maxfee = std::max(maxfee, txfee);
            minfee = std::min(minfee, txfee);
            totalfee += txfee;

            // New feerate uses satoshis per virtual byte instead of per serialized byte
            CAmount feerate = weight ? (txfee * WITNESS_SCALE_FACTOR) / weight : 0;
            if (do_feerate_percentiles) {
                feerate_array.emplace_back(feerate, weight);
            }
            maxfeerate = std::max(maxfeerate, feerate);
            minfeerate = std::min(minfeerate, feerate);
        }
    }

    CAmount feerate_percentiles[NUM_GETBLOCKSTATS_PERCENTILES] = { 0 };
    CalculatePercentilesByWeight(feerate_percentiles, feerate_array, total_weight);

    UniValue feerates_res(UniValue::VARR);
    for (int64_t i = 0; i < NUM_GETBLOCKSTATS_PERCENTILES; i++) {
        feerates_res.push_back(feerate_percentiles[i]);
    }

    UniValue ret_all(UniValue::VOBJ);
    ret_all.pushKV("avgfee", (block.vtx.size() > 1) ? totalfee / (block.vtx.size() - 1) : 0);
    ret_all.pushKV("avgfeerate", total_weight ? (totalfee * WITNESS_SCALE_FACTOR) / total_weight : 0); // Unit: sat/vbyte
    ret_all.pushKV("avgtxsize", (block.vtx.size() > 1) ? total_size / (block.vtx.size() - 1) : 0);
    ret_all.pushKV("blockhash", pindex.GetBlockHash().GetHex());
    ret_all.pushKV("feerate_percentiles", std::move(feerates_res));
    ret_all.pushKV("height", (int64_t)pindex.nHeight);
    ret_all.pushKV("ins", inputs);
    ret_all.pushKV("maxfee", maxfee);
    ret_all.pushKV("maxfeerate", maxfeerate);
    ret_all.pushKV("maxtxsize", maxtxsize);
    ret_all.pushKV("medianfee", CalculateTruncatedMedian(fee_array));
    ret_all.pushKV("mediantime", pindex.GetMedianTimePast());
    ret_all.pushKV("mediantxsize", CalculateTruncatedMedian(txsize_array));
    ret_all.pushKV("minfee", (minfee == MAX_MONEY) ? 0 : minfee);
    ret_all.pushKV("minfeerate", (minfeerate == MAX_MONEY) ? 0 : minfeerate);
    ret_all.pushKV("mintxsize", mintxsize == MAX_BLOCK_SERIALIZED_SIZE ? 0 : mintxsize);
    ret_all.pushKV("outs", outputs);
    ret_all.pushKV("subsidy", GetBlockSubsidy(pindex.nHeight, chainman.GetParams().GetConsensus()));
    ret_all.pushKV("swtotal_size", swtotal_size);
    ret_all.pushKV("swtotal_weight", swtotal_weight);
    ret_all.pushKV("swtxs", swtxs);
    ret_all.pushKV("time", pindex.GetBlockTime());
    ret_all.pushKV("total_out", total_out);
    ret_all.pushKV("total_size", total_size);
    ret_all.pushKV("total_weight", total_weight);
    ret_all.pushKV("totalfee", totalfee);
    ret_all.pushKV("txs", (int64_t)block.vtx.size());
    ret_all.pushKV("utxo_increase", outputs - inputs);
    ret_all.pushKV("utxo_size_inc", utxo_size_inc);
    ret_all.pushKV("utxo_increase_actual", utxos - inputs);
    ret_all.pushKV("utxo_size_inc_actual", utxo_size_inc_actual);

    if (do_all) {
        return ret_all;
    }

    UniValue ret(UniValue::VOBJ);
    for (const std::string& stat : stats) {
        const UniValue& value = ret_all[stat];
        if (value.isNull()) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Invalid selected statistic '%s'", stat));
        }
        ret.pushKV(stat, value);
    }
    return ret;
},
    };
}